

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveFile.cpp
# Opt level: O1

void __thiscall CDirectiveHeaderSize::writeTempData(CDirectiveHeaderSize *this,TempData *tempData)

{
  int64_t memoryAddress;
  char *pcVar1;
  long *in_R8;
  string local_48;
  char *local_28;
  char *local_20;
  
  memoryAddress = this->virtualAddress;
  pcVar1 = (char *)this->headerSize;
  local_20 = "";
  if ((long)pcVar1 < 0) {
    local_20 = "-";
  }
  local_28 = (char *)-(long)pcVar1;
  if (0 < (long)pcVar1) {
    local_28 = pcVar1;
  }
  tinyformat::format<char_const*,long>
            (&local_48,(tinyformat *)".headersize %s0x%08X",(char *)&local_20,&local_28,in_R8);
  TempData::writeLine(tempData,memoryAddress,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void CDirectiveHeaderSize::writeTempData(TempData& tempData) const
{
	tempData.writeLine(virtualAddress,tfm::format(".headersize %s0x%08X",
		headerSize < 0 ? "-" : "", headerSize < 0 ? -headerSize : headerSize));
}